

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMTypeRef CompileLlvmType(LlvmCompilationContext *ctx,TypeBase *type)

{
  LLVMTypeRefOpaque **ppLVar1;
  LLVMTypeRef pLVar2;
  char *__src;
  int iVar3;
  ExpressionContext *pEVar4;
  undefined4 extraout_var;
  uint uVar5;
  uint uVar6;
  TypeBase *type_00;
  ulong uVar7;
  long lVar8;
  SmallArray<LLVMTypeRefOpaque_*,_32U> members;
  LLVMTypeRef local_148;
  SmallArray<LLVMTypeRefOpaque_*,_32U> local_140;
  
  uVar7 = (ulong)type->typeIndex;
  uVar6 = (ctx->types).count;
  if (uVar6 <= type->typeIndex) goto LAB_0017e804;
  ppLVar1 = (ctx->types).data;
  pLVar2 = ppLVar1[uVar7];
  if (pLVar2 != (LLVMTypeRef)0x0) {
    return pLVar2;
  }
  switch(type->typeID) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0x19:
    ppLVar1[uVar7] = (LLVMTypeRefOpaque *)&placeholderType;
    goto LAB_0017e6ea;
  case 0xb:
  case 0x10:
  case 0x11:
    pEVar4 = ctx->ctx;
LAB_0017e684:
    type_00 = pEVar4->typeChar;
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x1ba,"LLVMTypeRef CompileLlvmType(LlvmCompilationContext &, TypeBase *)");
  case 0x12:
    type_00 = (TypeBase *)type[1]._vptr_TypeBase;
    pEVar4 = ctx->ctx;
    if (type_00 == pEVar4->typeVoid) goto LAB_0017e684;
    break;
  case 0x13:
    CompileLlvmType(ctx,(TypeBase *)type[1]._vptr_TypeBase);
    uVar5 = type->typeIndex;
    uVar6 = (ctx->types).count;
    goto LAB_0017e6d3;
  case 0x14:
    type_00 = *(TypeBase **)&type[1].typeIndex;
    break;
  case 0x15:
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    type_00 = ctx->ctx->typeNullPtr;
    break;
  case 0x18:
    __src = (type->name).begin;
    uVar7 = (long)(type->name).end - (long)__src;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar7 + 1));
    uVar7 = uVar7 & 0xffffffff;
    memcpy((void *)CONCAT44(extraout_var,iVar3),__src,uVar7);
    *(undefined1 *)((long)CONCAT44(extraout_var,iVar3) + uVar7) = 0;
    uVar6 = type->typeIndex;
    uVar5 = (ctx->types).count;
    if (uVar5 <= uVar6) goto LAB_0017e804;
    (ctx->types).data[uVar6] = (LLVMTypeRefOpaque *)&placeholderType;
    local_140.allocator = ctx->allocator;
    local_140.data = local_140.little;
    local_140.count = 0;
    local_140.max = 0x20;
    lVar8._0_4_ = type[1].typeID;
    lVar8._4_4_ = type[1].nameHash;
    if (lVar8 != 0) {
      do {
        local_148 = CompileLlvmType(ctx,*(TypeBase **)(*(long *)(lVar8 + 8) + 0x20));
        SmallArray<LLVMTypeRefOpaque_*,_32U>::push_back(&local_140,&local_148);
        lVar8 = *(long *)(lVar8 + 0x18);
      } while (lVar8 != 0);
      uVar6 = type->typeIndex;
      uVar5 = (ctx->types).count;
    }
    if (uVar5 <= uVar6) goto LAB_0017e804;
    SmallArray<LLVMTypeRefOpaque_*,_32U>::~SmallArray(&local_140);
    uVar7 = (ulong)type->typeIndex;
    uVar6 = (ctx->types).count;
    goto LAB_0017e6ea;
  }
  CompileLlvmType(ctx,type_00);
  uVar5 = type->typeIndex;
  uVar6 = (ctx->types).count;
LAB_0017e6d3:
  uVar7 = (ulong)uVar5;
  if (uVar5 < uVar6) {
    (ctx->types).data[uVar7] = (LLVMTypeRefOpaque *)&placeholderType;
LAB_0017e6ea:
    if ((uint)uVar7 < uVar6) {
      return (ctx->types).data[uVar7];
    }
  }
LAB_0017e804:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<LLVMTypeRefOpaque *, 128>::operator[](unsigned int) [T = LLVMTypeRefOpaque *, N = 128]"
               );
}

Assistant:

LLVMTypeRef CompileLlvmType(LlvmCompilationContext &ctx, TypeBase *type)
{
	if(LLVMTypeRef llvmType = ctx.types[type->typeIndex])
		return llvmType;

	if(isType<TypeVoid>(type))
	{
		ctx.types[type->typeIndex] = LLVMVoidTypeInContext(ctx.context);
	}
	else if(isType<TypeBool>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt1TypeInContext(ctx.context);
	}
	else if(isType<TypeChar>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt8TypeInContext(ctx.context);
	}
	else if(isType<TypeShort>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt16TypeInContext(ctx.context);
	}
	else if(isType<TypeInt>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeLong>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt64TypeInContext(ctx.context);
	}
	else if(isType<TypeFloat>(type))
	{
		ctx.types[type->typeIndex] = LLVMFloatTypeInContext(ctx.context);
	}
	else if(isType<TypeDouble>(type))
	{
		ctx.types[type->typeIndex] = LLVMDoubleTypeInContext(ctx.context);
	}
	else if(isType<TypeTypeID>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeFunctionID>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeNullptr>(type))
	{
		ctx.types[type->typeIndex] = LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0);
	}
	else if(isType<TypeAutoRef>(type))
	{
		LLVMTypeRef members[2] = { LLVMInt32TypeInContext(ctx.context), LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(isType<TypeAutoArray>(type))
	{
		LLVMTypeRef members[3] = { LLVMInt32TypeInContext(ctx.context), LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0), LLVMInt32TypeInContext(ctx.context) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 3, true);
	}
	else if(TypeRef *typeRef = getType<TypeRef>(type))
	{
		ctx.types[type->typeIndex] = LLVMPointerType(CompileLlvmType(ctx, typeRef->subType == ctx.ctx.typeVoid ? ctx.ctx.typeChar : typeRef->subType), 0);
	}
	else if(TypeArray *typeArray = getType<TypeArray>(type))
	{
		if(typeArray->subType == ctx.ctx.typeChar)
			ctx.types[type->typeIndex] = LLVMArrayType(CompileLlvmType(ctx, typeArray->subType), ((unsigned)typeArray->length + 3u) & ~3u);
		else
			ctx.types[type->typeIndex] = LLVMArrayType(CompileLlvmType(ctx, typeArray->subType), (unsigned)typeArray->length);
	}
	else if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(type))
	{
		LLVMTypeRef members[2] = { LLVMPointerType(CompileLlvmType(ctx, typeUnsizedArray->subType), 0), LLVMInt32TypeInContext(ctx.context) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(isType<TypeFunction>(type))
	{
		// TODO: use function indices and remap before execution
		//LLVMTypeRef members[2] = { LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0), LLVMInt32TypeInContext(ctx.context) };
		LLVMTypeRef members[2] = { CompileLlvmType(ctx, ctx.ctx.typeNullPtr), CompileLlvmType(ctx, ctx.ctx.typeNullPtr) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		ctx.types[type->typeIndex] = LLVMStructCreateNamed(ctx.context, CreateLlvmName(ctx, typeClass->name));

		SmallArray<LLVMTypeRef, 32> members(ctx.allocator);

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			members.push_back(CompileLlvmType(ctx, curr->variable->type));

		// TODO: create packed type with custom padding
		LLVMStructSetBody(ctx.types[type->typeIndex], members.data, members.count, false);
	}
	else if(isType<TypeEnum>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else
	{
		assert(!"unknown type");
	}

	return ctx.types[type->typeIndex];
}